

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O3

int lyb_print_data(lyout *out,lyd_node *root,int options)

{
  ly_ctx *ctx;
  lys_submodule *plVar1;
  bool bVar2;
  lys_module **pplVar3;
  lys_module **pplVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  lys_module *plVar8;
  lys_node *plVar9;
  lys_module *plVar10;
  lys_module **pplVar11;
  ulong uVar12;
  long lVar13;
  lyd_node *plVar14;
  ulong uVar15;
  long lVar16;
  lys_module **pplVar17;
  undefined1 auStack_b8 [8];
  lyb_state lybs;
  hash_table *local_68;
  hash_table *top_sibling_ht;
  lys_module **local_58;
  uint8_t byte;
  lys_module **local_48;
  lys_module **models;
  size_t mod_count;
  uint8_t zero;
  
  mod_count._7_1_ = 0;
  local_68 = (hash_table *)0x0;
  lybs.sib_ht = (anon_struct_16_2_515384b0 *)0x0;
  lybs.mod_count = 0;
  lybs._44_4_ = 0;
  lybs.ctx = (ly_ctx *)0x0;
  lybs.used = 0;
  lybs.size = 0;
  lybs.models = (lys_module **)0x0;
  lybs.position = (size_t *)0x0;
  lybs.inner_chunks = (uint8_t *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  lybs.written = (size_t *)0x0;
  if (root != (lyd_node *)0x0) {
    plVar8 = lyd_node_module(root);
    ctx = plVar8->ctx;
    plVar9 = root->schema;
    lybs._40_8_ = ctx;
    do {
      plVar9 = lys_parent(plVar9);
      if (plVar9 == (lys_node *)0x0) goto LAB_0019b6a4;
    } while (plVar9->nodetype == LYS_USES);
    if (plVar9->nodetype != LYS_EXT) {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"LYB printer supports only printing top-level nodes.");
      return 1;
    }
  }
LAB_0019b6a4:
  local_58 = (lys_module **)CONCAT53(local_58._3_5_,0x62796c);
  iVar5 = ly_write(out,(char *)&local_58,3);
  mod_count._0_4_ = 1;
  if (-1 < iVar5) {
    local_58 = (lys_module **)((ulong)local_58 & 0xffffffffffffff00);
    iVar5 = ly_write(out,(char *)&local_58,1);
    if (-1 < iVar5) {
      local_48 = (lys_module **)0x0;
      models = (lys_module **)0x0;
      if (root == (lyd_node *)0x0) {
        local_58 = (lys_module **)0x0;
        iVar5 = lyb_write(out,(uint8_t *)&local_58,2,(lyb_state *)auStack_b8);
        if (iVar5 < 0) goto LAB_0019ba55;
      }
      else {
        top_sibling_ht._4_4_ = options;
        _byte = root;
        do {
          plVar8 = lyd_node_module(root);
          add_model(&local_48,(size_t *)&models,plVar8);
          plVar14 = _byte;
          root = root->next;
        } while (root != (lyd_node *)0x0);
        top_sibling_ht._0_4_ = ly_ctx_internal_modules_count(_byte->schema->module->ctx);
        plVar8 = ly_ctx_get_module_iter(plVar14->schema->module->ctx,(uint32_t *)&top_sibling_ht);
        if (plVar8 != (lys_module *)0x0) {
LAB_0019b765:
          pplVar4 = models;
          pplVar3 = local_48;
          if ((plVar8->field_0x40 & 0x80) != 0) {
            if (plVar8->deviation_size != '\0') {
              uVar15 = 0;
              do {
                plVar9 = plVar8->deviation[uVar15].orig_node;
                if ((plVar9 != (lys_node *)0x0) &&
                   (plVar10 = lys_node_module(plVar9), pplVar4 != (lys_module **)0x0)) {
                  pplVar11 = (lys_module **)0x0;
                  do {
                    if (pplVar3[(long)pplVar11] == plVar10) goto LAB_0019b8df;
                    pplVar11 = (lys_module **)((long)pplVar11 + 1);
                  } while (pplVar4 != pplVar11);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < plVar8->deviation_size);
            }
            pplVar4 = models;
            pplVar3 = local_48;
            if (plVar8->augment_size != '\0') {
              uVar15 = 0;
              do {
                plVar10 = lys_node_module(plVar8->augment[uVar15].target);
                if (pplVar4 != (lys_module **)0x0) {
                  pplVar11 = (lys_module **)0x0;
                  do {
                    if (pplVar3[(long)pplVar11] == plVar10) goto LAB_0019b8df;
                    pplVar11 = (lys_module **)((long)pplVar11 + 1);
                  } while (pplVar4 != pplVar11);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < plVar8->augment_size);
            }
            pplVar4 = models;
            pplVar3 = local_48;
            if (plVar8->inc_size != '\0') {
              uVar15 = 0;
              do {
                plVar1 = plVar8->inc[uVar15].submodule;
                if (plVar1->deviation_size != '\0') {
                  uVar12 = 0;
                  do {
                    plVar9 = plVar1->deviation[uVar12].orig_node;
                    if ((plVar9 != (lys_node *)0x0) &&
                       (plVar10 = lys_node_module(plVar9), pplVar4 != (lys_module **)0x0)) {
                      pplVar11 = (lys_module **)0x0;
                      do {
                        if (pplVar3[(long)pplVar11] == plVar10) goto LAB_0019b8df;
                        pplVar11 = (lys_module **)((long)pplVar11 + 1);
                      } while (pplVar4 != pplVar11);
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 < plVar1->deviation_size);
                }
                if (plVar1->augment_size != '\0') {
                  uVar12 = 0;
                  do {
                    plVar10 = lys_node_module(plVar1->augment[uVar12].target);
                    if (pplVar4 != (lys_module **)0x0) {
                      pplVar11 = (lys_module **)0x0;
                      do {
                        if (pplVar3[(long)pplVar11] == plVar10) goto LAB_0019b8df;
                        pplVar11 = (lys_module **)((long)pplVar11 + 1);
                      } while (pplVar4 != pplVar11);
                    }
                    uVar12 = uVar12 + 1;
                  } while (uVar12 < plVar1->augment_size);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < plVar8->inc_size);
            }
          }
          goto LAB_0019b8ef;
        }
LAB_0019b912:
        pplVar4 = models;
        pplVar3 = local_48;
        local_58 = models;
        iVar5 = lyb_write(out,(uint8_t *)&local_58,2,(lyb_state *)auStack_b8);
        if (pplVar4 != (lys_module **)0x0) {
          pplVar11 = (lys_module **)0x0;
          pplVar17 = (lys_module **)0x1;
          do {
            iVar6 = lyb_print_model(out,pplVar3[(long)pplVar11],(lyb_state *)auStack_b8);
            iVar5 = iVar5 + iVar6;
            bVar2 = pplVar17 < pplVar4;
            pplVar11 = pplVar17;
            pplVar17 = (lys_module **)(ulong)((int)pplVar17 + 1);
          } while (bVar2);
        }
        free(pplVar3);
        uVar7 = top_sibling_ht._4_4_;
        if (iVar5 < 0) goto LAB_0019ba55;
        if (_byte != (lyd_node *)0x0) {
          plVar8 = (lys_module *)0x0;
          plVar14 = _byte;
          do {
            plVar10 = lyd_node_module(plVar14);
            if (plVar10 != plVar8) {
              local_68 = (hash_table *)0x0;
              plVar8 = lyd_node_module(plVar14);
            }
            mod_count._0_4_ = 1;
            iVar5 = lyb_print_subtree(out,plVar14,&local_68,(lyb_state *)auStack_b8,1);
            if (iVar5 < 0) goto LAB_0019ba55;
          } while (((uVar7 & 1) != 0) && (plVar14 = plVar14->next, plVar14 != (lyd_node *)0x0));
        }
      }
      uVar7 = lyb_write(out,(uint8_t *)((long)&mod_count + 7),1,(lyb_state *)auStack_b8);
      mod_count._0_4_ = uVar7 >> 0x1f;
    }
  }
LAB_0019ba55:
  free((void *)auStack_b8);
  free(lybs.written);
  free(lybs.position);
  if (0 < (int)lybs.sib_ht) {
    lVar13 = 8;
    lVar16 = 0;
    do {
      lyht_free(*(hash_table **)((long)&((lybs.ctx)->dict).hash_tab + lVar13));
      lVar16 = lVar16 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar16 < (int)lybs.sib_ht);
  }
  free(lybs.ctx);
  return (uint)mod_count;
LAB_0019b8df:
  add_model(&local_48,(size_t *)&models,plVar8);
LAB_0019b8ef:
  plVar8 = ly_ctx_get_module_iter(_byte->schema->module->ctx,(uint32_t *)&top_sibling_ht);
  if (plVar8 == (lys_module *)0x0) goto LAB_0019b912;
  goto LAB_0019b765;
}

Assistant:

int
lyb_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    int r, ret = 0, rc = EXIT_SUCCESS;
    uint8_t zero = 0;
    struct hash_table *top_sibling_ht = NULL;
    const struct lys_module *prev_mod = NULL;
    struct lys_node *parent;
    struct lyb_state lybs;

    memset(&lybs, 0, sizeof lybs);

    if (root) {
        lybs.ctx = lyd_node_module(root)->ctx;

        for (parent = lys_parent(root->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
        if (parent && (parent->nodetype != LYS_EXT)) {
            LOGERR(lybs.ctx, LY_EINVAL, "LYB printer supports only printing top-level nodes.");
            return EXIT_FAILURE;
        }
    }

    /* LYB magic number */
    ret += (r = lyb_print_magic_number(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* LYB header */
    ret += (r = lyb_print_header(out));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    /* all used models */
    ret += (r = lyb_print_data_models(out, root, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
        goto finish;
    }

    LY_TREE_FOR(root, root) {
        /* do not reuse sibling hash tables from different modules */
        if (lyd_node_module(root) != prev_mod) {
            top_sibling_ht = NULL;
            prev_mod = lyd_node_module(root);
        }

        ret += (r = lyb_print_subtree(out, root, &top_sibling_ht, &lybs, 1));
        if (r < 0) {
            rc = EXIT_FAILURE;
            goto finish;
        }

        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    /* ending zero byte */
    ret += (r = lyb_write(out, &zero, sizeof zero, &lybs));
    if (r < 0) {
        rc = EXIT_FAILURE;
    }

finish:
    free(lybs.written);
    free(lybs.position);
    free(lybs.inner_chunks);
    for (r = 0; r < lybs.sib_ht_count; ++r) {
        lyht_free(lybs.sib_ht[r].ht);
    }
    free(lybs.sib_ht);

    return rc;
}